

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_proxy_module.c
# Opt level: O0

ngx_int_t ngx_http_proxy_create_request(ngx_http_request_t *r)

{
  ngx_http_upstream_t *pnVar1;
  void *pvVar2;
  void *pvVar3;
  undefined1 *puVar4;
  char *pcVar5;
  undefined8 uVar6;
  bool bVar7;
  ngx_int_t nVar8;
  long lVar9;
  uintptr_t uVar10;
  void *pvVar11;
  ngx_chain_t *pnVar12;
  size_t local_178;
  undefined8 *local_170;
  ngx_http_script_len_code_pt lcode;
  ngx_http_proxy_loc_conf_t *plcf;
  ngx_http_script_engine_t le;
  ngx_http_script_engine_t e;
  ngx_http_proxy_headers_t *headers;
  ngx_http_script_code_pt code;
  ngx_http_proxy_ctx_t *ctx;
  ngx_http_upstream_t *u;
  ngx_table_elt_t *header;
  ngx_list_part_t *part;
  ngx_chain_t *body;
  ngx_chain_t *cl;
  ngx_uint_t unparsed_uri;
  ngx_uint_t i;
  ngx_str_t method;
  ngx_buf_t *b;
  uintptr_t escape;
  size_t body_len;
  size_t loc_len;
  size_t uri_len;
  size_t len;
  ngx_http_request_t *r_local;
  
  pnVar1 = r->upstream;
  pvVar2 = r->loc_conf[ngx_http_proxy_module.ctx_index];
  if ((*(ushort *)&pnVar1->field_0x3e8 >> 1 & 1) == 0) {
    local_170 = (undefined8 *)((long)pvVar2 + 0x1e0);
  }
  else {
    local_170 = (undefined8 *)((long)pvVar2 + 0x208);
  }
  if ((pnVar1->method).len == 0) {
    if (*(long *)((long)pvVar2 + 0x260) == 0) {
      i = (r->method_name).len;
      method.len = (size_t)(r->method_name).data;
    }
    else {
      nVar8 = ngx_http_complex_value
                        (r,*(ngx_http_complex_value_t **)((long)pvVar2 + 0x260),(ngx_str_t *)&i);
      if (nVar8 != 0) {
        return (ngx_int_t)(ngx_http_request_t *)0xffffffffffffffff;
      }
    }
  }
  else {
    i = (pnVar1->method).len;
    method.len = (size_t)(pnVar1->method).data;
  }
  pvVar3 = r->ctx[ngx_http_proxy_module.ctx_index];
  if ((i == 4) && (nVar8 = ngx_strncasecmp((u_char *)method.len,(u_char *)"HEAD",4), nVar8 == 0)) {
    *(byte *)((long)pvVar3 + 0xa8) = *(byte *)((long)pvVar3 + 0xa8) & 0xfe | 1;
  }
  lVar9 = i + 0xe;
  b = (ngx_buf_t *)0x0;
  body_len = 0;
  bVar7 = false;
  if ((*(long *)((long)pvVar2 + 0x238) == 0) || (*(long *)((long)pvVar3 + 0x80) == 0)) {
    if ((*(long *)((long)pvVar3 + 0x80) == 0) &&
       (((*(ulong *)&r->field_0x460 >> 0x2c & 1) != 0 && (r == r->main)))) {
      bVar7 = true;
      loc_len = (r->unparsed_uri).len;
    }
    else {
      if ((((uint)((ulong)*(undefined8 *)&r->field_0x460 >> 0x2b) & 1) == 0) ||
         (*(long *)((long)pvVar3 + 0x80) == 0)) {
        local_178 = 0;
      }
      else {
        local_178 = *(size_t *)((long)pvVar2 + 0x268);
      }
      body_len = local_178;
      if ((((*(ulong *)&r->field_0x460 >> 0x26 & 1) != 0) ||
          ((*(ulong *)&r->field_0x460 >> 0x28 & 1) != 0)) ||
         ((*(ulong *)&r->field_0x468 >> 0xe & 1) != 0)) {
        uVar10 = ngx_escape_uri((u_char *)0x0,(r->uri).data + local_178,(r->uri).len - local_178,0);
        b = (ngx_buf_t *)(uVar10 << 1);
      }
      loc_len = (long)b + (r->args).len +
                          ((*(long *)((long)pvVar3 + 0x80) + (r->uri).len) - local_178) + 1;
    }
  }
  else {
    loc_len = *(size_t *)((long)pvVar3 + 0x80);
  }
  if (loc_len == 0) {
    if (3 < r->connection->log->log_level) {
      ngx_log_error_core(4,r->connection->log,0,"zero length URI to proxy");
    }
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else {
    uri_len = loc_len + lVar9;
    memset(&plcf,0,0x58);
    ngx_http_script_flush_no_cacheable_variables(r,*(ngx_array_t **)((long)pvVar2 + 0x1b8));
    ngx_http_script_flush_no_cacheable_variables(r,(ngx_array_t *)*local_170);
    if (*(long *)((long)pvVar2 + 0x1c0) == 0) {
      if (((*(ushort *)&(r->headers_in).field_0x168 >> 2 & 1) == 0) ||
         ((*(ulong *)&r->field_0x468 >> 0xd & 1) == 0)) {
        *(off_t *)((long)pvVar3 + 0x90) = (r->headers_in).content_length_n;
      }
      else {
        *(undefined8 *)((long)pvVar3 + 0x90) = 0xffffffffffffffff;
        *(byte *)((long)pvVar3 + 0xa8) = *(byte *)((long)pvVar3 + 0xa8) & 0xfd | 2;
      }
    }
    else {
      plcf = (ngx_http_proxy_loc_conf_t *)**(undefined8 **)((long)pvVar2 + 0x1c0);
      le.args._0_1_ = (byte)le.args & 0xfe | 1;
      escape = 0;
      le.status = (ngx_int_t)r;
      while ((plcf->upstream).upstream != (ngx_http_upstream_srv_conf_t *)0x0) {
        lVar9 = (*(code *)(plcf->upstream).upstream)(&plcf);
        escape = lVar9 + escape;
      }
      *(uintptr_t *)((long)pvVar3 + 0x90) = escape;
      uri_len = escape + uri_len;
    }
    le.args._0_1_ = (byte)le.args & 0xfe | 1;
    le.status = (ngx_int_t)r;
    for (plcf = *(ngx_http_proxy_loc_conf_t **)local_170[1];
        (plcf->upstream).upstream != (ngx_http_upstream_srv_conf_t *)0x0;
        plcf = (ngx_http_proxy_loc_conf_t *)&(plcf->upstream).connect_timeout) {
      while ((plcf->upstream).upstream != (ngx_http_upstream_srv_conf_t *)0x0) {
        lVar9 = (*(code *)(plcf->upstream).upstream)(&plcf);
        uri_len = lVar9 + uri_len;
      }
    }
    if (*(long *)((long)pvVar2 + 0xb0) != 0) {
      header = (ngx_table_elt_t *)&(r->headers_in).headers.part;
      u = (ngx_http_upstream_t *)((ngx_list_part_t *)header)->elts;
      unparsed_uri = 0;
      do {
        if ((header->key).len <= unparsed_uri) {
          if ((header->key).data == (u_char *)0x0) break;
          header = (ngx_table_elt_t *)(header->key).data;
          u = (ngx_http_upstream_t *)header->hash;
          unparsed_uri = 0;
        }
        pvVar11 = ngx_hash_find((ngx_hash_t *)(local_170 + 3),
                                (ngx_uint_t)(&u->read_event_handler)[unparsed_uri * 6],
                                (u_char *)(&(u->peer).name)[unparsed_uri * 6],
                                (size_t)(&u->write_event_handler)[unparsed_uri * 6]);
        if (pvVar11 == (void *)0x0) {
          uri_len = (size_t)((&u->write_event_handler)[unparsed_uri * 6] +
                            (long)((&(u->peer).sockaddr)[unparsed_uri * 6]->sa_data + uri_len + 2));
        }
        unparsed_uri = unparsed_uri + 1;
      } while( true );
    }
    method.data = (u_char *)ngx_create_temp_buf(r->pool,uri_len);
    if ((ngx_buf_t *)method.data == (ngx_buf_t *)0x0) {
      r_local = (ngx_http_request_t *)0xffffffffffffffff;
    }
    else {
      body = ngx_alloc_chain_link(r->pool);
      if (body == (ngx_chain_t *)0x0) {
        r_local = (ngx_http_request_t *)0xffffffffffffffff;
      }
      else {
        body->buf = (ngx_buf_t *)method.data;
        pvVar11 = *(void **)(method.data + 8);
        memcpy(pvVar11,(void *)method.len,i);
        *(ngx_uint_t *)(method.data + 8) = (long)pvVar11 + i;
        puVar4 = *(undefined1 **)(method.data + 8);
        *(undefined1 **)(method.data + 8) = puVar4 + 1;
        *puVar4 = 0x20;
        (pnVar1->uri).data = *(u_char **)(method.data + 8);
        if ((*(long *)((long)pvVar2 + 0x238) == 0) || (*(long *)((long)pvVar3 + 0x80) == 0)) {
          if (bVar7) {
            pvVar11 = *(void **)(method.data + 8);
            memcpy(pvVar11,(r->unparsed_uri).data,(r->unparsed_uri).len);
            *(size_t *)(method.data + 8) = (long)pvVar11 + (r->unparsed_uri).len;
          }
          else {
            if ((*(ulong *)&r->field_0x460 >> 0x2b & 1) != 0) {
              pvVar11 = *(void **)(method.data + 8);
              memcpy(pvVar11,*(void **)((long)pvVar3 + 0x88),*(size_t *)((long)pvVar3 + 0x80));
              *(long *)(method.data + 8) = (long)pvVar11 + *(long *)((long)pvVar3 + 0x80);
            }
            if (b == (ngx_buf_t *)0x0) {
              pvVar11 = *(void **)(method.data + 8);
              memcpy(pvVar11,(r->uri).data + body_len,(r->uri).len - body_len);
              *(size_t *)(method.data + 8) = (long)pvVar11 + ((r->uri).len - body_len);
            }
            else {
              ngx_escape_uri(*(u_char **)(method.data + 8),(r->uri).data + body_len,
                             (r->uri).len - body_len,0);
              *(size_t *)(method.data + 8) =
                   (long)b + *(long *)(method.data + 8) + ((r->uri).len - body_len);
            }
            if ((r->args).len != 0) {
              puVar4 = *(undefined1 **)(method.data + 8);
              *(undefined1 **)(method.data + 8) = puVar4 + 1;
              *puVar4 = 0x3f;
              pvVar11 = *(void **)(method.data + 8);
              memcpy(pvVar11,(r->args).data,(r->args).len);
              *(size_t *)(method.data + 8) = (long)pvVar11 + (r->args).len;
            }
          }
        }
        else {
          pvVar11 = *(void **)(method.data + 8);
          memcpy(pvVar11,*(void **)((long)pvVar3 + 0x88),*(size_t *)((long)pvVar3 + 0x80));
          *(long *)(method.data + 8) = (long)pvVar11 + *(long *)((long)pvVar3 + 0x80);
        }
        (pnVar1->uri).len = *(long *)(method.data + 8) - (long)(pnVar1->uri).data;
        if (*(long *)((long)pvVar2 + 0x308) == 0x3e9) {
          pcVar5 = *(char **)(method.data + 8);
          *(undefined8 *)pcVar5 = ngx_http_proxy_version_11._0_8_;
          *(undefined2 *)(pcVar5 + 8) = ngx_http_proxy_version_11._8_2_;
          pcVar5[10] = ngx_http_proxy_version_11[10];
          *(char **)(method.data + 8) = pcVar5 + 0xb;
        }
        else {
          pcVar5 = *(char **)(method.data + 8);
          *(undefined8 *)pcVar5 = ngx_http_proxy_version._0_8_;
          *(undefined2 *)(pcVar5 + 8) = ngx_http_proxy_version._8_2_;
          pcVar5[10] = ngx_http_proxy_version[10];
          *(char **)(method.data + 8) = pcVar5 + 0xb;
        }
        memset(&le.request,0,0x58);
        le.request = *(ngx_http_request_t **)local_170[2];
        uVar6 = *(undefined8 *)(method.data + 8);
        plcf = *(ngx_http_proxy_loc_conf_t **)local_170[1];
        while ((plcf->upstream).upstream != (ngx_http_upstream_srv_conf_t *)0x0) {
          (*(code *)(plcf->upstream).upstream)(&plcf);
          if ((plcf->upstream).upstream != (ngx_http_upstream_srv_conf_t *)0x0) {
            while ((plcf->upstream).upstream != (ngx_http_upstream_srv_conf_t *)0x0) {
              (*(code *)(plcf->upstream).upstream)(&plcf);
            }
          }
          plcf = (ngx_http_proxy_loc_conf_t *)&(plcf->upstream).connect_timeout;
          while (*(long *)le.request != 0) {
            (**(code **)le.request)(&le.request);
          }
          le.request = (ngx_http_request_t *)&(le.request)->connection;
        }
        *(undefined8 *)(method.data + 8) = uVar6;
        if (*(long *)((long)pvVar2 + 0xb0) != 0) {
          header = (ngx_table_elt_t *)&(r->headers_in).headers.part;
          u = (ngx_http_upstream_t *)((ngx_list_part_t *)header)->elts;
          unparsed_uri = 0;
          do {
            if ((header->key).len <= unparsed_uri) {
              if ((header->key).data == (u_char *)0x0) break;
              header = (ngx_table_elt_t *)(header->key).data;
              u = (ngx_http_upstream_t *)header->hash;
              unparsed_uri = 0;
            }
            pvVar11 = ngx_hash_find((ngx_hash_t *)(local_170 + 3),
                                    (ngx_uint_t)(&u->read_event_handler)[unparsed_uri * 6],
                                    (u_char *)(&(u->peer).name)[unparsed_uri * 6],
                                    (size_t)(&u->write_event_handler)[unparsed_uri * 6]);
            if (pvVar11 == (void *)0x0) {
              pvVar11 = *(void **)(method.data + 8);
              memcpy(pvVar11,(&(u->peer).connection)[unparsed_uri * 6],
                     (size_t)(&u->write_event_handler)[unparsed_uri * 6]);
              *(ngx_http_upstream_handler_pt *)(method.data + 8) =
                   (ngx_http_upstream_handler_pt)
                   ((long)pvVar11 + (long)(&u->write_event_handler)[unparsed_uri * 6]);
              puVar4 = *(undefined1 **)(method.data + 8);
              *(undefined1 **)(method.data + 8) = puVar4 + 1;
              *puVar4 = 0x3a;
              puVar4 = *(undefined1 **)(method.data + 8);
              *(undefined1 **)(method.data + 8) = puVar4 + 1;
              *puVar4 = 0x20;
              pvVar11 = *(void **)(method.data + 8);
              memcpy(pvVar11,*(void **)(&(u->peer).socklen + unparsed_uri * 0xc),
                     (size_t)(&(u->peer).sockaddr)[unparsed_uri * 6]);
              *(long *)(method.data + 8) =
                   (long)pvVar11 + (long)(&(u->peer).sockaddr)[unparsed_uri * 6];
              puVar4 = *(undefined1 **)(method.data + 8);
              *(undefined1 **)(method.data + 8) = puVar4 + 1;
              *puVar4 = 0xd;
              puVar4 = *(undefined1 **)(method.data + 8);
              *(undefined1 **)(method.data + 8) = puVar4 + 1;
              *puVar4 = 10;
              if ((r->connection->log->log_level & 0x100) != 0) {
                ngx_log_error_core(8,r->connection->log,0,"http proxy header: \"%V: %V\"",
                                   &u->write_event_handler + unparsed_uri * 6,
                                   &(u->peer).sockaddr + unparsed_uri * 6);
              }
            }
            unparsed_uri = unparsed_uri + 1;
          } while( true );
        }
        puVar4 = *(undefined1 **)(method.data + 8);
        *(undefined1 **)(method.data + 8) = puVar4 + 1;
        *puVar4 = 0xd;
        puVar4 = *(undefined1 **)(method.data + 8);
        *(undefined1 **)(method.data + 8) = puVar4 + 1;
        *puVar4 = 10;
        if (*(long *)((long)pvVar2 + 0x1c8) != 0) {
          le.request = (ngx_http_request_t *)**(undefined8 **)((long)pvVar2 + 0x1c8);
          uVar6 = *(undefined8 *)(method.data + 8);
          while (*(long *)le.request != 0) {
            (**(code **)le.request)(&le.request);
          }
          *(undefined8 *)(method.data + 8) = uVar6;
        }
        if ((r->connection->log->log_level & 0x100) != 0) {
          ngx_log_error_core(8,r->connection->log,0,"http proxy header:%N\"%*s\"",
                             *(long *)(method.data + 8) - *(long *)method.data,
                             *(undefined8 *)method.data);
        }
        if ((*(ulong *)&r->field_0x460 >> 0x3a & 1) == 0) {
          if ((*(long *)((long)pvVar2 + 0x1c8) == 0) && (*(long *)((long)pvVar2 + 0xb8) != 0)) {
            part = (ngx_list_part_t *)pnVar1->request_bufs;
            pnVar1->request_bufs = body;
            for (; part != (ngx_list_part_t *)0x0; part = (ngx_list_part_t *)part->nelts) {
              method.data = (u_char *)ngx_palloc(r->pool,0x50);
              if (method.data == (u_char *)0x0) {
                return (ngx_int_t)(ngx_http_request_t *)0xffffffffffffffff;
              }
              memcpy(method.data,part->elts,0x50);
              pnVar12 = ngx_alloc_chain_link(r->pool);
              body->next = pnVar12;
              if (body->next == (ngx_chain_t *)0x0) {
                return (ngx_int_t)(ngx_http_request_t *)0xffffffffffffffff;
              }
              body = body->next;
              body->buf = (ngx_buf_t *)method.data;
            }
          }
          else {
            pnVar1->request_bufs = body;
          }
        }
        else {
          pnVar1->request_bufs = body;
          if ((*(byte *)((long)pvVar3 + 0xa8) >> 1 & 1) != 0) {
            (pnVar1->output).output_filter = ngx_http_proxy_body_output_filter;
            (pnVar1->output).filter_ctx = r;
          }
        }
        *(ushort *)(method.data + 0x48) = *(ushort *)(method.data + 0x48) & 0xffdf | 0x20;
        body->next = (ngx_chain_t *)0x0;
        r_local = (ngx_http_request_t *)0x0;
      }
    }
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_proxy_create_request(ngx_http_request_t *r)
{
    size_t                        len, uri_len, loc_len, body_len;
    uintptr_t                     escape;
    ngx_buf_t                    *b;
    ngx_str_t                     method;
    ngx_uint_t                    i, unparsed_uri;
    ngx_chain_t                  *cl, *body;
    ngx_list_part_t              *part;
    ngx_table_elt_t              *header;
    ngx_http_upstream_t          *u;
    ngx_http_proxy_ctx_t         *ctx;
    ngx_http_script_code_pt       code;
    ngx_http_proxy_headers_t     *headers;
    ngx_http_script_engine_t      e, le;
    ngx_http_proxy_loc_conf_t    *plcf;
    ngx_http_script_len_code_pt   lcode;

    u = r->upstream;

    plcf = ngx_http_get_module_loc_conf(r, ngx_http_proxy_module);

#if (NGX_HTTP_CACHE)
    headers = u->cacheable ? &plcf->headers_cache : &plcf->headers;
#else
    headers = &plcf->headers;
#endif

    if (u->method.len) {
        /* HEAD was changed to GET to cache response */
        method = u->method;

    } else if (plcf->method) {
        if (ngx_http_complex_value(r, plcf->method, &method) != NGX_OK) {
            return NGX_ERROR;
        }

    } else {
        method = r->method_name;
    }

    ctx = ngx_http_get_module_ctx(r, ngx_http_proxy_module);

    if (method.len == 4
        && ngx_strncasecmp(method.data, (u_char *) "HEAD", 4) == 0)
    {
        ctx->head = 1;
    }

    len = method.len + 1 + sizeof(ngx_http_proxy_version) - 1
          + sizeof(CRLF) - 1;

    escape = 0;
    loc_len = 0;
    unparsed_uri = 0;

    if (plcf->proxy_lengths && ctx->vars.uri.len) {
        uri_len = ctx->vars.uri.len;

    } else if (ctx->vars.uri.len == 0 && r->valid_unparsed_uri && r == r->main)
    {
        unparsed_uri = 1;
        uri_len = r->unparsed_uri.len;

    } else {
        loc_len = (r->valid_location && ctx->vars.uri.len) ?
                      plcf->location.len : 0;

        if (r->quoted_uri || r->space_in_uri || r->internal) {
            escape = 2 * ngx_escape_uri(NULL, r->uri.data + loc_len,
                                        r->uri.len - loc_len, NGX_ESCAPE_URI);
        }

        uri_len = ctx->vars.uri.len + r->uri.len - loc_len + escape
                  + sizeof("?") - 1 + r->args.len;
    }

    if (uri_len == 0) {
        ngx_log_error(NGX_LOG_ERR, r->connection->log, 0,
                      "zero length URI to proxy");
        return NGX_ERROR;
    }

    len += uri_len;

    ngx_memzero(&le, sizeof(ngx_http_script_engine_t));

    ngx_http_script_flush_no_cacheable_variables(r, plcf->body_flushes);
    ngx_http_script_flush_no_cacheable_variables(r, headers->flushes);

    if (plcf->body_lengths) {
        le.ip = plcf->body_lengths->elts;
        le.request = r;
        le.flushed = 1;
        body_len = 0;

        while (*(uintptr_t *) le.ip) {
            lcode = *(ngx_http_script_len_code_pt *) le.ip;
            body_len += lcode(&le);
        }

        ctx->internal_body_length = body_len;
        len += body_len;

    } else if (r->headers_in.chunked && r->reading_body) {
        ctx->internal_body_length = -1;
        ctx->internal_chunked = 1;

    } else {
        ctx->internal_body_length = r->headers_in.content_length_n;
    }

    le.ip = headers->lengths->elts;
    le.request = r;
    le.flushed = 1;

    while (*(uintptr_t *) le.ip) {
        while (*(uintptr_t *) le.ip) {
            lcode = *(ngx_http_script_len_code_pt *) le.ip;
            len += lcode(&le);
        }
        le.ip += sizeof(uintptr_t);
    }


    if (plcf->upstream.pass_request_headers) {
        part = &r->headers_in.headers.part;
        header = part->elts;

        for (i = 0; /* void */; i++) {

            if (i >= part->nelts) {
                if (part->next == NULL) {
                    break;
                }

                part = part->next;
                header = part->elts;
                i = 0;
            }

            if (ngx_hash_find(&headers->hash, header[i].hash,
                              header[i].lowcase_key, header[i].key.len))
            {
                continue;
            }

            len += header[i].key.len + sizeof(": ") - 1
                + header[i].value.len + sizeof(CRLF) - 1;
        }
    }


    b = ngx_create_temp_buf(r->pool, len);
    if (b == NULL) {
        return NGX_ERROR;
    }

    cl = ngx_alloc_chain_link(r->pool);
    if (cl == NULL) {
        return NGX_ERROR;
    }

    cl->buf = b;


    /* the request line */

    b->last = ngx_copy(b->last, method.data, method.len);
    *b->last++ = ' ';

    u->uri.data = b->last;

    if (plcf->proxy_lengths && ctx->vars.uri.len) {
        b->last = ngx_copy(b->last, ctx->vars.uri.data, ctx->vars.uri.len);

    } else if (unparsed_uri) {
        b->last = ngx_copy(b->last, r->unparsed_uri.data, r->unparsed_uri.len);

    } else {
        if (r->valid_location) {
            b->last = ngx_copy(b->last, ctx->vars.uri.data, ctx->vars.uri.len);
        }

        if (escape) {
            ngx_escape_uri(b->last, r->uri.data + loc_len,
                           r->uri.len - loc_len, NGX_ESCAPE_URI);
            b->last += r->uri.len - loc_len + escape;

        } else {
            b->last = ngx_copy(b->last, r->uri.data + loc_len,
                               r->uri.len - loc_len);
        }

        if (r->args.len > 0) {
            *b->last++ = '?';
            b->last = ngx_copy(b->last, r->args.data, r->args.len);
        }
    }

    u->uri.len = b->last - u->uri.data;

    if (plcf->http_version == NGX_HTTP_VERSION_11) {
        b->last = ngx_cpymem(b->last, ngx_http_proxy_version_11,
                             sizeof(ngx_http_proxy_version_11) - 1);

    } else {
        b->last = ngx_cpymem(b->last, ngx_http_proxy_version,
                             sizeof(ngx_http_proxy_version) - 1);
    }

    ngx_memzero(&e, sizeof(ngx_http_script_engine_t));

    e.ip = headers->values->elts;
    e.pos = b->last;
    e.request = r;
    e.flushed = 1;

    le.ip = headers->lengths->elts;

    while (*(uintptr_t *) le.ip) {
        lcode = *(ngx_http_script_len_code_pt *) le.ip;

        /* skip the header line name length */
        (void) lcode(&le);

        if (*(ngx_http_script_len_code_pt *) le.ip) {

            for (len = 0; *(uintptr_t *) le.ip; len += lcode(&le)) {
                lcode = *(ngx_http_script_len_code_pt *) le.ip;
            }

            e.skip = (len == sizeof(CRLF) - 1) ? 1 : 0;

        } else {
            e.skip = 0;
        }

        le.ip += sizeof(uintptr_t);

        while (*(uintptr_t *) e.ip) {
            code = *(ngx_http_script_code_pt *) e.ip;
            code((ngx_http_script_engine_t *) &e);
        }
        e.ip += sizeof(uintptr_t);
    }

    b->last = e.pos;


    if (plcf->upstream.pass_request_headers) {
        part = &r->headers_in.headers.part;
        header = part->elts;

        for (i = 0; /* void */; i++) {

            if (i >= part->nelts) {
                if (part->next == NULL) {
                    break;
                }

                part = part->next;
                header = part->elts;
                i = 0;
            }

            if (ngx_hash_find(&headers->hash, header[i].hash,
                              header[i].lowcase_key, header[i].key.len))
            {
                continue;
            }

            b->last = ngx_copy(b->last, header[i].key.data, header[i].key.len);

            *b->last++ = ':'; *b->last++ = ' ';

            b->last = ngx_copy(b->last, header[i].value.data,
                               header[i].value.len);

            *b->last++ = CR; *b->last++ = LF;

            ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                           "http proxy header: \"%V: %V\"",
                           &header[i].key, &header[i].value);
        }
    }


    /* add "\r\n" at the header end */
    *b->last++ = CR; *b->last++ = LF;

    if (plcf->body_values) {
        e.ip = plcf->body_values->elts;
        e.pos = b->last;
        e.skip = 0;

        while (*(uintptr_t *) e.ip) {
            code = *(ngx_http_script_code_pt *) e.ip;
            code((ngx_http_script_engine_t *) &e);
        }

        b->last = e.pos;
    }

    ngx_log_debug2(NGX_LOG_DEBUG_HTTP, r->connection->log, 0,
                   "http proxy header:%N\"%*s\"",
                   (size_t) (b->last - b->pos), b->pos);

    if (r->request_body_no_buffering) {

        u->request_bufs = cl;

        if (ctx->internal_chunked) {
            u->output.output_filter = ngx_http_proxy_body_output_filter;
            u->output.filter_ctx = r;
        }

    } else if (plcf->body_values == NULL && plcf->upstream.pass_request_body) {

        body = u->request_bufs;
        u->request_bufs = cl;

        while (body) {
            b = ngx_alloc_buf(r->pool);
            if (b == NULL) {
                return NGX_ERROR;
            }

            ngx_memcpy(b, body->buf, sizeof(ngx_buf_t));

            cl->next = ngx_alloc_chain_link(r->pool);
            if (cl->next == NULL) {
                return NGX_ERROR;
            }

            cl = cl->next;
            cl->buf = b;

            body = body->next;
        }

    } else {
        u->request_bufs = cl;
    }

    b->flush = 1;
    cl->next = NULL;

    return NGX_OK;
}